

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O3

int sndio_stream_start(cubeb_stream_conflict2 *s)

{
  int iVar1;
  int iVar2;
  
  s->active = 1;
  iVar2 = 0;
  iVar1 = pthread_create(&s->th,(pthread_attr_t *)0x0,sndio_mainloop,s);
  if (iVar1 != 0) {
    s->active = 0;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
sndio_stream_start(cubeb_stream * s)
{
  int err;

  DPR("sndio_stream_start()\n");
  s->active = 1;
  err = pthread_create(&s->th, NULL, sndio_mainloop, s);
  if (err) {
    s->active = 0;
    return CUBEB_ERROR;
  }
  return CUBEB_OK;
}